

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flowtest.cc
# Opt level: O0

Token __thiscall flowtest::Lexer::parseNumber(Lexer *this)

{
  int iVar1;
  Lexer *this_local;
  
  this->numberValue_ = 0;
  while( true ) {
    iVar1 = currentChar(this);
    iVar1 = isdigit(iVar1);
    if (iVar1 == 0) break;
    this->numberValue_ = this->numberValue_ * 10;
    iVar1 = currentChar(this);
    this->numberValue_ = iVar1 + -0x30 + this->numberValue_;
    nextChar(this,1);
  }
  return Number;
}

Assistant:

Token Lexer::parseNumber() {
  numberValue_ = 0;

  while (std::isdigit(currentChar())) {
    numberValue_ *= 10;
    numberValue_ += currentChar() - '0';
    nextChar();
  }
  return Token::Number;
}